

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lttng.cpp
# Opt level: O2

void writeLttng(QFile *file,Provider *provider)

{
  int *piVar1;
  QString *this;
  QString *this_00;
  int iVar2;
  Argument *pAVar3;
  bool bVar4;
  QTextStream *pQVar5;
  char *pcVar6;
  TraceEnum *pTVar7;
  TraceFlags *pTVar8;
  Tracepoint *pTVar9;
  Field *pFVar10;
  EnumValue *pEVar11;
  FlagValue *pFVar12;
  Tracepoint *string;
  long lVar13;
  long lVar14;
  QString *pQVar15;
  int n;
  EnumValue *l;
  EnumValue *args;
  FlagValue *l_1;
  FlagValue *args_00;
  ulong uVar16;
  FlagValue *v_1;
  FlagValue *pFVar17;
  TraceFlags *pTVar18;
  Field *pFVar19;
  Data *pDVar20;
  EnumValue *v;
  TraceEnum *name;
  EnumValue *string_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_118;
  QTextStream stream;
  QStringBuilder<const_QString_&,_QString> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stream.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&stream,(QIODevice *)file);
  local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d._0_4_ = 0xaaaaaaaa;
  local_118.d._4_4_ = 0xaaaaaaaa;
  local_118.ptr._0_4_ = 0xaaaaaaaa;
  local_118.ptr._4_4_ = 0xaaaaaaaa;
  (*(file->super_QFileDevice).super_QIODevice._vptr_QIODevice[0x13])(&local_f8,file);
  QFileInfo::QFileInfo((QFileInfo *)&local_58,(QString *)&local_f8);
  QFileInfo::fileName((QString *)&local_118,(QFileInfo *)&local_58);
  QFileInfo::~QFileInfo((QFileInfo *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  writeCommonPrologue(&stream);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  includeGuard((QString *)&local_58,(QString *)&local_118);
  QTextStream::operator<<(&stream,"#undef TRACEPOINT_PROVIDER\n");
  pQVar5 = QTextStream::operator<<(&stream,"#define TRACEPOINT_PROVIDER ");
  pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
  QTextStream::operator<<(pQVar5,"\n");
  QTextStream::operator<<(&stream,"\n");
  pQVar5 = QTextStream::operator<<(&stream,"#if !defined(");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_58);
  QTextStream::operator<<(pQVar5,")\n");
  pcVar6 = qtHeaders();
  QTextStream::operator<<(&stream,pcVar6);
  QTextStream::operator<<(&stream,"\n");
  if ((provider->prefixText).d.size != 0) {
    QListSpecialMethods<QString>::join
              ((QString *)&local_f8,(QListSpecialMethods<QString> *)&provider->prefixText,(QChar)0xa
              );
    pQVar5 = QTextStream::operator<<(&stream,(QString *)&local_f8);
    QTextStream::operator<<(pQVar5,"\n\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  }
  QTextStream::operator<<(&stream,"#endif\n\n");
  pQVar5 = QTextStream::operator<<(&stream,"#if !defined(");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_58);
  QTextStream::operator<<(pQVar5,") || defined(TRACEPOINT_HEADER_MULTI_READ)\n");
  pQVar5 = QTextStream::operator<<(&stream,"#define ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_58);
  pQVar5 = QTextStream::operator<<(pQVar5,"\n\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#undef TRACEPOINT_INCLUDE\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#define TRACEPOINT_INCLUDE \"");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_118);
  QTextStream::operator<<(pQVar5,"\"\n\n");
  QTextStream::operator<<(&stream,"#include <lttng/tracepoint.h>\n\n");
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  local_90.d = (Data *)0x0;
  local_f8.b.d.d = (Data *)0x0;
  local_90.ptr = (char16_t *)0x0;
  local_90.size = 0;
  local_f8.b.d.ptr = L"_USE_NAMESPACE";
  local_f8.b.d.size = 0xe;
  local_f8.a = (QString *)&local_58;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>((QString *)&local_78,&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  pQVar5 = QTextStream::operator<<(&stream,"#if !defined(");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
  pQVar5 = QTextStream::operator<<(pQVar5,")\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#define ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
  pQVar5 = QTextStream::operator<<(pQVar5,"\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"QT_USE_NAMESPACE\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#endif // ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
  QTextStream::operator<<(pQVar5,"\n\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  name = (provider->enumerations).d.ptr;
  pTVar7 = name + (provider->enumerations).d.size;
  for (; name != pTVar7; name = name + 1) {
    pQVar5 = QTextStream::operator<<(&stream,"TRACEPOINT_ENUM(\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    ");
    pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
    pQVar5 = QTextStream::operator<<(pQVar5,",\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    ");
    typeToTypeName((QString *)&local_f8,&name->name);
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
    pQVar5 = QTextStream::operator<<(pQVar5,",\n");
    QTextStream::operator<<(pQVar5,"    TP_ENUM_VALUES(\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    string_00 = (name->values).d.ptr;
    pEVar11 = string_00 + (name->values).d.size;
    while( true ) {
      if (string_00 == pEVar11) break;
      if (string_00->range < 1) {
        piVar1 = &string_00->value;
        bVar4 = QListSpecialMethodsBase<int>::contains<int>
                          ((QListSpecialMethodsBase<int> *)&local_58,piVar1);
        if (!bVar4) {
          pQVar5 = QTextStream::operator<<(&stream,"        ctf_enum_value(\"");
          iVar2 = *piVar1;
          local_f8.b.d.ptr = (char16_t *)0x0;
          local_f8.a = (QString *)0x0;
          local_f8.b.d.d = (Data *)0x0;
          args = (name->values).d.ptr;
          for (lVar13 = (name->values).d.size << 5; lVar13 != 0; lVar13 = lVar13 + -0x20) {
            if (args->value == iVar2) {
              QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_f8,&args->name);
            }
            args = args + 1;
          }
          QListSpecialMethods<QString>::join
                    ((QString *)&local_78,(QListSpecialMethods<QString> *)&local_f8,(QChar)0x5f);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_f8);
          pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
          pQVar5 = QTextStream::operator<<(pQVar5,"\", ");
          pQVar5 = QTextStream::operator<<(pQVar5,*piVar1);
          QTextStream::operator<<(pQVar5,")\n");
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QList<int>::append((QList<int> *)&local_58,*piVar1);
        }
      }
      else {
        pQVar5 = QTextStream::operator<<(&stream,"        ctf_enum_range(\"");
        pQVar5 = QTextStream::operator<<(pQVar5,&string_00->name);
        pQVar5 = QTextStream::operator<<(pQVar5,"\", ");
        pQVar5 = QTextStream::operator<<(pQVar5,string_00->value);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,string_00->range);
        QTextStream::operator<<(pQVar5,")\n");
      }
      string_00 = string_00 + 1;
    }
    QTextStream::operator<<(&stream,"    )\n)\n\n");
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_58);
  }
  pTVar18 = (provider->flags).d.ptr;
  pTVar8 = pTVar18 + (provider->flags).d.size;
  for (; pTVar18 != pTVar8; pTVar18 = pTVar18 + 1) {
    pQVar5 = QTextStream::operator<<(&stream,"TRACEPOINT_ENUM(\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    ");
    pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
    pQVar5 = QTextStream::operator<<(pQVar5,",\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    ");
    typeToTypeName((QString *)&local_f8,&pTVar18->name);
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
    pQVar5 = QTextStream::operator<<(pQVar5,",\n");
    QTextStream::operator<<(pQVar5,"    TP_ENUM_VALUES(\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    pFVar17 = (pTVar18->values).d.ptr;
    pFVar12 = pFVar17 + (pTVar18->values).d.size;
    for (; pFVar17 != pFVar12; pFVar17 = pFVar17 + 1) {
      piVar1 = &pFVar17->value;
      bVar4 = QListSpecialMethodsBase<int>::contains<int>
                        ((QListSpecialMethodsBase<int> *)&local_58,piVar1);
      if (!bVar4) {
        pQVar5 = QTextStream::operator<<(&stream,"        ctf_enum_value(\"");
        iVar2 = *piVar1;
        local_f8.b.d.ptr = (char16_t *)0x0;
        local_f8.a = (QString *)0x0;
        local_f8.b.d.d = (Data *)0x0;
        args_00 = (pTVar18->values).d.ptr;
        for (lVar13 = (pTVar18->values).d.size << 5; lVar13 != 0; lVar13 = lVar13 + -0x20) {
          if (args_00->value == iVar2) {
            QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_f8,&args_00->name);
          }
          args_00 = args_00 + 1;
        }
        QListSpecialMethods<QString>::join
                  ((QString *)&local_78,(QListSpecialMethods<QString> *)&local_f8,(QChar)0x5f);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_f8);
        pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
        pQVar5 = QTextStream::operator<<(pQVar5,"\", ");
        pQVar5 = QTextStream::operator<<(pQVar5,*piVar1);
        QTextStream::operator<<(pQVar5,")\n");
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QList<int>::append((QList<int> *)&local_58,*piVar1);
      }
    }
    QTextStream::operator<<(&stream,"    )\n)\n\n");
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_58);
  }
  local_f8.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)0x0;
  local_90.d = (Data *)0x0;
  local_90.ptr = (char16_t *)0x0;
  local_78.ptr = L"TP_%1_CONVERTERS";
  local_90.size = 0;
  local_78.size = 0x10;
  QString::arg<QString,_true>
            ((QString *)&local_58,(QString *)&local_78,&provider->name,0,(QChar)0x20);
  QString::toUpper_helper((QString *)&local_f8,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  pQVar5 = QTextStream::operator<<(&stream,"\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#ifndef ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
  pQVar5 = QTextStream::operator<<(pQVar5,"\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#define ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
  QTextStream::operator<<(pQVar5,"\n");
  QTextStream::operator<<(&stream,"QT_BEGIN_NAMESPACE\n");
  QTextStream::operator<<(&stream,"namespace QtPrivate {\n");
  pTVar18 = (provider->flags).d.ptr;
  pTVar8 = pTVar18 + (provider->flags).d.size;
  for (; pTVar18 != pTVar8; pTVar18 = pTVar18 + 1) {
    pQVar5 = QTextStream::operator<<(&stream,"inline QByteArray trace_convert_");
    typeToTypeName((QString *)&local_58,&pTVar18->name);
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_58);
    pQVar5 = QTextStream::operator<<(pQVar5,"(");
    pQVar5 = QTextStream::operator<<(pQVar5,&pTVar18->name);
    QTextStream::operator<<(pQVar5," val)\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QTextStream::operator<<(&stream,"{\n");
    QTextStream::operator<<(&stream,"    QByteArray ret;\n");
    QTextStream::operator<<(&stream,"    if (val == 0) { ret.append((char)0); return ret; }\n");
    pFVar17 = (pTVar18->values).d.ptr;
    lVar13 = (pTVar18->values).d.size;
    for (lVar14 = 0; lVar13 << 5 != lVar14; lVar14 = lVar14 + 0x20) {
      if (*(int *)((long)&pFVar17->value + lVar14) != 0) {
        pQVar5 = QTextStream::operator<<(&stream,"    if (val & ");
        pQVar5 = QTextStream::operator<<
                           (pQVar5,1 << (*(char *)((long)&pFVar17->value + lVar14) - 1U & 0x1f));
        pQVar5 = QTextStream::operator<<(pQVar5,") { ret.append((char)");
        pQVar5 = QTextStream::operator<<(pQVar5,*(int *)((long)&pFVar17->value + lVar14));
        QTextStream::operator<<(pQVar5,"); };\n");
      }
    }
    QTextStream::operator<<(&stream,"    return ret;\n");
    QTextStream::operator<<(&stream,"}\n");
  }
  pQVar5 = QTextStream::operator<<(&stream,"} // namespace QtPrivate\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"QT_END_NAMESPACE\n\n");
  pQVar5 = QTextStream::operator<<(pQVar5,"#endif // ");
  pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
  QTextStream::operator<<(pQVar5,"\n\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  string = (provider->tracepoints).d.ptr;
  pTVar9 = string + (provider->tracepoints).d.size;
  do {
    if (string == pTVar9) {
      QTextStream::operator<<(&stream,"\n");
      pQVar5 = QTextStream::operator<<(&stream,"#endif // ");
      includeGuard((QString *)&local_f8,(QString *)&local_118);
      pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
      pQVar5 = QTextStream::operator<<(pQVar5,"\n");
      pQVar5 = QTextStream::operator<<(pQVar5,"#include <lttng/tracepoint-event.h>\n");
      QTextStream::operator<<(pQVar5,"#include <private/qtrace_p.h>\n");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QTextStream::~QTextStream(&stream);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    pQVar5 = QTextStream::operator<<(&stream,"TRACEPOINT_EVENT(\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    ");
    pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
    pQVar5 = QTextStream::operator<<(pQVar5,",\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    ");
    pQVar5 = QTextStream::operator<<(pQVar5,&string->name);
    pQVar5 = QTextStream::operator<<(pQVar5,",\n");
    QTextStream::operator<<(pQVar5,"    TP_ARGS(");
    lVar13 = 0x18;
    lVar14 = 0;
    pcVar6 = (char *)0x0;
    for (uVar16 = 0; uVar16 < (ulong)(string->args).d.size; uVar16 = uVar16 + 1) {
      pAVar3 = (string->args).d.ptr;
      iVar2 = *(int *)((long)&((string->fields).d.ptr)->backendType + lVar14);
      pQVar5 = QTextStream::operator<<(&stream,pcVar6);
      if (iVar2 == 0xf) {
        pQVar5 = QTextStream::operator<<(pQVar5,"QByteArray, ");
      }
      else {
        pQVar5 = QTextStream::operator<<(pQVar5,(QString *)((long)pAVar3 + lVar13 + -0x18));
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
      }
      QTextStream::operator<<(pQVar5,(QString *)((long)&(pAVar3->type).d.d + lVar13));
      lVar14 = lVar14 + 0x58;
      lVar13 = lVar13 + 0x38;
      pcVar6 = ", ";
    }
    pQVar5 = QTextStream::operator<<(&stream,"),\n");
    QTextStream::operator<<(pQVar5,"    TP_FIELDS(");
    pFVar19 = (string->fields).d.ptr;
    pFVar10 = pFVar19 + (string->fields).d.size;
    pcVar6 = (char *)0x0;
    for (; pFVar19 != pFVar10; pFVar19 = pFVar19 + 1) {
      QTextStream::operator<<(&stream,pcVar6);
      this = &pFVar19->paramType;
      this_00 = &pFVar19->name;
      iVar2 = pFVar19->arrayLen;
      if (0 < iVar2) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_f8.a = (QString *)0x0;
        local_f8.b.d.d = (Data *)0x13187c;
        local_58.size = 0;
        local_f8.b.d.ptr = (char16_t *)0x6;
        bVar4 = comparesEqual(this,(QString *)&local_f8);
        if (bVar4) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0010c4c3:
          pcVar6 = (char *)0x0;
          for (n = 0; iVar2 != n; n = n + 1) {
            QTextStream::operator<<(&stream,pcVar6);
            pQVar5 = QTextStream::operator<<(&stream,"ctf_float(");
            pQVar5 = QTextStream::operator<<(pQVar5,this);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,this_00);
            pQVar5 = QTextStream::operator<<(pQVar5,"_");
            QString::number((QString *)&local_f8,n,10);
            pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
            pQVar5 = QTextStream::operator<<(pQVar5,", ");
            pQVar5 = QTextStream::operator<<(pQVar5,this_00);
            pQVar5 = QTextStream::operator<<(pQVar5,"[");
            QString::number((QString *)&local_58,n,10);
            pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_58);
            pQVar5 = QTextStream::operator<<(pQVar5,"]");
            QTextStream::operator<<(pQVar5,")");
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_f8);
            pcVar6 = "\n        ";
          }
          goto switchD_0010c42e_default;
        }
        local_90.d = (Data *)0x0;
        local_90.ptr = (char16_t *)0x0;
        local_78.d = (Data *)0x0;
        local_78.ptr = L"float";
        local_90.size = 0;
        local_78.size = 5;
        bVar4 = comparesEqual(this,(QString *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (bVar4) goto LAB_0010c4c3;
        pQVar5 = QTextStream::operator<<(&stream,"ctf_array(");
        pQVar5 = QTextStream::operator<<(pQVar5,this);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,iVar2);
        goto LAB_0010c937;
      }
      pQVar15 = this_00;
      switch(pFVar19->backendType) {
      case Sequence:
        pQVar15 = &pFVar19->seqLen;
        pQVar5 = QTextStream::operator<<(&stream,"ctf_sequence(");
        pQVar5 = QTextStream::operator<<(pQVar5,this);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", unsigned int, ");
        goto LAB_0010c932;
      case Boolean:
      case Integer:
        pcVar6 = "ctf_integer(";
        goto LAB_0010c8ef;
      case IntegerHex:
      case Pointer:
        pcVar6 = "ctf_integer_hex(";
        goto LAB_0010c8ef;
      case Float:
        pcVar6 = "ctf_float(";
LAB_0010c8ef:
        pQVar5 = QTextStream::operator<<(&stream,pcVar6);
        pQVar5 = QTextStream::operator<<(pQVar5,this);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
LAB_0010c932:
        pQVar5 = QTextStream::operator<<(pQVar5,pQVar15);
LAB_0010c937:
        pcVar6 = ")";
        break;
      case String:
        pQVar5 = QTextStream::operator<<(&stream,"ctf_string(");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        goto LAB_0010c932;
      case QtString:
        pQVar5 = QTextStream::operator<<(&stream,"ctf_string(");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pcVar6 = ".toUtf8().constData())";
        break;
      case QtByteArray:
        pcVar6 = "ctf_sequence(const char, ";
        goto LAB_0010c952;
      case QtUrl:
        pQVar5 = QTextStream::operator<<(&stream,"ctf_string(");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pcVar6 = ".toString().toUtf8().constData())";
        break;
      case QtRect:
        pcVar6 = "ctf_integer(int, QRect_";
        goto LAB_0010c9d7;
      case QtSize:
        pcVar6 = "ctf_integer(int, QSize_";
        goto LAB_0010c9b6;
      case QtRectF:
        pcVar6 = "ctf_float(double, QRectF_";
LAB_0010c9d7:
        pQVar5 = QTextStream::operator<<(&stream,pcVar6);
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,"_x, ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,".x()) ");
        pQVar5 = QTextStream::operator<<(pQVar5,pcVar6);
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,"_y, ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,".y()) ");
        pQVar5 = QTextStream::operator<<(pQVar5,pcVar6);
LAB_0010ca65:
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,"_width, ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,".width()) ");
        pQVar5 = QTextStream::operator<<(pQVar5,pcVar6);
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,"_height, ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pcVar6 = ".height()) ";
        break;
      case QtSizeF:
        pcVar6 = "ctf_float(double, QSizeF_";
LAB_0010c9b6:
        pQVar5 = QTextStream::operator<<(&stream,pcVar6);
        goto LAB_0010ca65;
      case EnumeratedType:
        pQVar5 = QTextStream::operator<<(&stream,"ctf_enum(");
        pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        typeToTypeName((QString *)&local_f8,this);
        pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
        pQVar5 = QTextStream::operator<<(pQVar5,", int, ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        QTextStream::operator<<(pQVar5,") ");
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
        goto switchD_0010c42e_default;
      case FlagType:
        pcVar6 = "ctf_sequence(const char , ";
LAB_0010c952:
        pQVar5 = QTextStream::operator<<(&stream,pcVar6);
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,", ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pQVar5 = QTextStream::operator<<(pQVar5,".constData(), unsigned int, ");
        pQVar5 = QTextStream::operator<<(pQVar5,this_00);
        pcVar6 = ".size())";
        break;
      case Unknown:
        QString::toLocal8Bit((QByteArray *)&local_f8,this);
        pDVar20 = local_f8.b.d.d;
        if (local_f8.b.d.d == (Data *)0x0) {
          pDVar20 = (Data *)"";
        }
        QString::toLocal8Bit((QByteArray *)&local_58,this_00);
        pcVar6 = (char *)local_58.ptr;
        if (local_58.ptr == (char16_t *)0x0) {
          pcVar6 = "";
        }
        panic("Cannot deduce CTF type for \'%s %s",pDVar20,pcVar6);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
      default:
        goto switchD_0010c42e_default;
      }
      QTextStream::operator<<(pQVar5,pcVar6);
switchD_0010c42e_default:
      pcVar6 = "\n        ";
    }
    QTextStream::operator<<(&stream,")\n)\n\n");
    local_f8.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    formatFunctionSignature((QString *)&local_f8,&string->args);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    formatParameterList((QString *)&local_58,provider,&string->args,&string->fields,LTTNG);
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (char16_t *)0x0;
    local_c0.d = (Data *)0x0;
    local_c0.ptr = L"TP_%1_%2";
    local_d8.size = 0;
    local_c0.size = 8;
    QString::arg<QString,_true>
              ((QString *)&local_a8,(QString *)&local_c0,&provider->name,0,(QChar)0x20);
    QString::arg<QString,_true>
              ((QString *)&local_90,(QString *)&local_a8,&string->name,0,(QChar)0x20);
    QString::toUpper_helper((QString *)&local_78,(QString *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    pQVar5 = QTextStream::operator<<(&stream,"\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"#ifndef ");
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
    pQVar5 = QTextStream::operator<<(pQVar5,"\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"#define ");
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
    pQVar5 = QTextStream::operator<<(pQVar5,"\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"QT_BEGIN_NAMESPACE\n");
    QTextStream::operator<<(pQVar5,"namespace QtPrivate {\n");
    pQVar5 = QTextStream::operator<<(&stream,"inline void trace_");
    pQVar5 = QTextStream::operator<<(pQVar5,&string->name);
    pQVar5 = QTextStream::operator<<(pQVar5,"(");
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
    pQVar5 = QTextStream::operator<<(pQVar5,")\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"{\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    tracepoint(");
    pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
    pQVar5 = QTextStream::operator<<(pQVar5,", ");
    pQVar5 = QTextStream::operator<<(pQVar5,&string->name);
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_58);
    pQVar5 = QTextStream::operator<<(pQVar5,");\n");
    QTextStream::operator<<(pQVar5,"}\n");
    pQVar5 = QTextStream::operator<<(&stream,"inline void do_trace_");
    pQVar5 = QTextStream::operator<<(pQVar5,&string->name);
    pQVar5 = QTextStream::operator<<(pQVar5,"(");
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_f8);
    pQVar5 = QTextStream::operator<<(pQVar5,")\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"{\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    do_tracepoint(");
    pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
    pQVar5 = QTextStream::operator<<(pQVar5,", ");
    pQVar5 = QTextStream::operator<<(pQVar5,&string->name);
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_58);
    pQVar5 = QTextStream::operator<<(pQVar5,");\n");
    QTextStream::operator<<(pQVar5,"}\n");
    pQVar5 = QTextStream::operator<<(&stream,"inline bool trace_");
    pQVar5 = QTextStream::operator<<(pQVar5,&string->name);
    pQVar5 = QTextStream::operator<<(pQVar5,"_enabled()\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"{\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"    return tracepoint_enabled(");
    pQVar5 = QTextStream::operator<<(pQVar5,&provider->name);
    pQVar5 = QTextStream::operator<<(pQVar5,", ");
    pQVar5 = QTextStream::operator<<(pQVar5,&string->name);
    pQVar5 = QTextStream::operator<<(pQVar5,");\n");
    QTextStream::operator<<(pQVar5,"}\n");
    pQVar5 = QTextStream::operator<<(&stream,"} // namespace QtPrivate\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"QT_END_NAMESPACE\n");
    pQVar5 = QTextStream::operator<<(pQVar5,"#endif // ");
    pQVar5 = QTextStream::operator<<(pQVar5,(QString *)&local_78);
    QTextStream::operator<<(pQVar5,"\n\n");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    string = string + 1;
  } while( true );
}

Assistant:

void writeLttng(QFile &file, const Provider &provider)
{
    QTextStream stream(&file);

    const QString fileName = QFileInfo(file.fileName()).fileName();

    writePrologue(stream, fileName, provider);
    writeEnums(stream, provider);
    writeFlags(stream, provider);
    writeTracepoints(stream, provider);
    writeEpilogue(stream, fileName);
}